

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddPermProduct(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddObj *pAVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = a;
  if ((((a != 0) && (iVar2 = b, a != 1)) && (b != 0)) &&
     ((iVar2 = a, b != 1 && (iVar2 = Abc_ZddCacheLookup(p,a,b,6), iVar2 < 0)))) {
    pAVar1 = p->pObjs;
    iVar2 = Abc_ZddPermProduct(p,a,pAVar1[b].False);
    iVar3 = Abc_ZddPermProduct(p,a,pAVar1[b].True);
    iVar3 = Abc_ZddPerm(p,iVar3,*(uint *)(pAVar1 + b) & 0x7fffffff);
    iVar2 = Abc_ZddUnion(p,iVar2,iVar3);
    Abc_ZddCacheInsert(p,a,b,6,iVar2);
  }
  return iVar2;
}

Assistant:

int Abc_ZddPermProduct( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * B; 
    int r0, r1, r;
    if ( a == 0 ) return 0;
    if ( a == 1 ) return b;
    if ( b == 0 ) return 0;
    if ( b == 1 ) return a;
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_PERM_PROD)) >= 0 )
        return r;
    B  = Abc_ZddNode( p, b );
    r0 = Abc_ZddPermProduct( p, a, B->False ); 
    r1 = Abc_ZddPermProduct( p, a, B->True ); 
    r1 = Abc_ZddPerm( p, r1, B->Var );
    r  = Abc_ZddUnion( p, r0, r1 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_PERM_PROD, r );
}